

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O3

uint32_t __thiscall
icu_63::RuleBasedCollator::setVariableTop
          (RuleBasedCollator *this,UChar *varTop,int32_t len,UErrorCode *errorCode)

{
  byte bVar1;
  ulong uVar2;
  int64_t iVar3;
  UTF16CollationIterator ci;
  FCDUTF16CollationIterator local_238;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (len == 0 || varTop != (UChar *)0x0) {
      if (len < 0) {
        len = u_strlen_63(varTop);
      }
      if (len != 0) {
        bVar1 = (byte)this->settings->options;
        local_238.super_UTF16CollationIterator.super_CollationIterator.isNumeric = bVar1 >> 1 & 1;
        local_238.super_UTF16CollationIterator.limit = varTop + len;
        local_238.super_UTF16CollationIterator.start = varTop;
        local_238.super_UTF16CollationIterator.pos = varTop;
        if ((bVar1 & 1) == 0) {
          local_238.super_UTF16CollationIterator.super_CollationIterator.data = this->data;
          local_238.super_UTF16CollationIterator.super_CollationIterator.trie =
               (local_238.super_UTF16CollationIterator.super_CollationIterator.data)->trie;
          local_238.super_UTF16CollationIterator.super_CollationIterator.ceBuffer.buffer.ptr =
               local_238.super_UTF16CollationIterator.super_CollationIterator.ceBuffer.buffer.
               stackArray;
          local_238.super_UTF16CollationIterator.super_CollationIterator.ceBuffer.length = 0;
          local_238.super_UTF16CollationIterator.super_CollationIterator.ceBuffer.buffer.capacity =
               0x28;
          local_238.super_UTF16CollationIterator.super_CollationIterator.ceBuffer.buffer.
          needToRelease = '\0';
          local_238.super_UTF16CollationIterator.super_CollationIterator.cesIndex = 0;
          local_238.super_UTF16CollationIterator.super_CollationIterator.skipped =
               (SkippedState *)0x0;
          local_238.super_UTF16CollationIterator.super_CollationIterator.numCpFwd = -1;
          local_238.super_UTF16CollationIterator.super_CollationIterator.super_UObject._vptr_UObject
               = (_func_int **)&PTR__UTF16CollationIterator_003d5a60;
          uVar2 = CollationIterator::nextCE((CollationIterator *)&local_238,errorCode);
          iVar3 = CollationIterator::nextCE((CollationIterator *)&local_238,errorCode);
          UTF16CollationIterator::~UTF16CollationIterator(&local_238.super_UTF16CollationIterator);
        }
        else {
          local_238.super_UTF16CollationIterator.super_CollationIterator.data = this->data;
          local_238.super_UTF16CollationIterator.super_CollationIterator.trie =
               (local_238.super_UTF16CollationIterator.super_CollationIterator.data)->trie;
          local_238.super_UTF16CollationIterator.super_CollationIterator.ceBuffer.buffer.ptr =
               local_238.super_UTF16CollationIterator.super_CollationIterator.ceBuffer.buffer.
               stackArray;
          local_238.super_UTF16CollationIterator.super_CollationIterator.ceBuffer.length = 0;
          local_238.super_UTF16CollationIterator.super_CollationIterator.ceBuffer.buffer.capacity =
               0x28;
          local_238.super_UTF16CollationIterator.super_CollationIterator.ceBuffer.buffer.
          needToRelease = '\0';
          local_238.super_UTF16CollationIterator.super_CollationIterator.cesIndex = 0;
          local_238.super_UTF16CollationIterator.super_CollationIterator.skipped =
               (SkippedState *)0x0;
          local_238.super_UTF16CollationIterator.super_CollationIterator.numCpFwd = -1;
          local_238.super_UTF16CollationIterator.super_CollationIterator.super_UObject._vptr_UObject
               = (_func_int **)&PTR__FCDUTF16CollationIterator_003d5af0;
          local_238.segmentLimit = (UChar *)0x0;
          local_238.nfcImpl =
               (local_238.super_UTF16CollationIterator.super_CollationIterator.data)->nfcImpl;
          local_238.normalized.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)&PTR__UnicodeString_003e5ab8;
          local_238.normalized.fUnion.fStackFields.fLengthAndFlags = 2;
          local_238.checkDir = '\x01';
          local_238.rawStart = varTop;
          local_238.segmentStart = varTop;
          local_238.rawLimit = local_238.super_UTF16CollationIterator.limit;
          uVar2 = CollationIterator::nextCE((CollationIterator *)&local_238,errorCode);
          iVar3 = CollationIterator::nextCE((CollationIterator *)&local_238,errorCode);
          FCDUTF16CollationIterator::~FCDUTF16CollationIterator(&local_238);
        }
        if ((uVar2 != 0x101000100) && (iVar3 == 0x101000100)) {
          (*(this->super_Collator).super_UObject._vptr_UObject[0x1d])(this,uVar2 >> 0x20,errorCode);
          return this->settings->variableTop;
        }
        *errorCode = U_CE_NOT_FOUND_ERROR;
        return 0;
      }
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return 0;
}

Assistant:

uint32_t
RuleBasedCollator::setVariableTop(const UChar *varTop, int32_t len, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    if(varTop == NULL && len !=0) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    if(len < 0) { len = u_strlen(varTop); }
    if(len == 0) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    UBool numeric = settings->isNumeric();
    int64_t ce1, ce2;
    if(settings->dontCheckFCD()) {
        UTF16CollationIterator ci(data, numeric, varTop, varTop, varTop + len);
        ce1 = ci.nextCE(errorCode);
        ce2 = ci.nextCE(errorCode);
    } else {
        FCDUTF16CollationIterator ci(data, numeric, varTop, varTop, varTop + len);
        ce1 = ci.nextCE(errorCode);
        ce2 = ci.nextCE(errorCode);
    }
    if(ce1 == Collation::NO_CE || ce2 != Collation::NO_CE) {
        errorCode = U_CE_NOT_FOUND_ERROR;
        return 0;
    }
    setVariableTop((uint32_t)(ce1 >> 32), errorCode);
    return settings->variableTop;
}